

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O0

void ss_swapmerge(sauchar_t *T,saidx64_t *PA,saidx64_t *first,saidx64_t *middle,saidx64_t *last,
                 saidx64_t *buf,saidx64_t bufsize,saidx64_t depth)

{
  ulong *puVar1;
  saint_t sVar2;
  long lVar3;
  ulong *a;
  ulong *puVar4;
  ulong *in_RCX;
  ulong *puVar5;
  ulong *in_RDX;
  saidx64_t *in_RSI;
  saidx64_t *in_RDI;
  ulong *in_R8;
  long in_stack_00000008;
  saidx64_t in_stack_00000010;
  saint_t next;
  saint_t check;
  saint_t ssize;
  saidx64_t half;
  saidx64_t len;
  saidx64_t m;
  saidx64_t *rm;
  saidx64_t *lm;
  saidx64_t *r;
  saidx64_t *l;
  anon_struct_32_4_d8a569f3 stack [64];
  ulong local_960;
  ulong local_948;
  saidx64_t *in_stack_fffffffffffff6c8;
  saidx64_t *in_stack_fffffffffffff6d0;
  saidx64_t *in_stack_fffffffffffff6d8;
  saidx64_t *in_stack_fffffffffffff6e0;
  saidx64_t *in_stack_fffffffffffff6e8;
  saidx64_t *in_stack_fffffffffffff6f0;
  saidx64_t *in_stack_fffffffffffff6f8;
  sauchar_t *in_stack_fffffffffffff700;
  saidx64_t *in_stack_fffffffffffff710;
  ulong local_8e8;
  ulong local_8e0;
  ulong local_8c8;
  ulong local_8b0;
  ulong local_898;
  uint local_87c;
  uint local_878;
  int local_874;
  ulong local_870;
  ulong local_868;
  long local_860;
  ulong *local_848;
  ulong *local_840;
  undefined8 local_838 [3];
  uint auStack_820 [510];
  ulong *local_28;
  ulong *local_20;
  ulong *local_18;
  saidx64_t *local_10;
  saidx64_t *local_8;
  
  local_878 = 0;
  local_874 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    while (in_stack_00000008 < (long)local_28 - (long)local_20 >> 3) {
      if (in_stack_00000008 < (long)local_20 - (long)local_18 >> 3) {
        local_860 = 0;
        if ((long)local_20 - (long)local_18 >> 3 < (long)local_28 - (long)local_20 >> 3) {
          lVar3 = (long)local_20 - (long)local_18;
        }
        else {
          lVar3 = (long)local_28 - (long)local_20;
        }
        local_8e8 = lVar3 >> 3;
        local_868 = local_8e8;
        local_870 = lVar3 >> 4;
        while (0 < (long)local_868) {
          if ((long)local_20[local_860 + local_870] < 0) {
            in_stack_fffffffffffff700 =
                 (sauchar_t *)(local_20[local_860 + local_870] ^ 0xffffffffffffffff);
          }
          else {
            in_stack_fffffffffffff700 = (sauchar_t *)local_20[local_860 + local_870];
          }
          in_stack_fffffffffffff6f0 = local_10 + (long)in_stack_fffffffffffff700;
          if ((long)local_20[(-1 - local_870) - local_860] < 0) {
            in_stack_fffffffffffff6e8 =
                 (saidx64_t *)(local_20[(-1 - local_870) - local_860] ^ 0xffffffffffffffff);
          }
          else {
            in_stack_fffffffffffff6e8 = (saidx64_t *)local_20[(-1 - local_870) - local_860];
          }
          in_stack_fffffffffffff6f8 = local_10;
          in_stack_fffffffffffff710 = local_10;
          sVar2 = ss_compare((sauchar_t *)local_8,in_stack_fffffffffffff6f0,
                             local_10 + (long)in_stack_fffffffffffff6e8,in_stack_00000010);
          if (sVar2 < 0) {
            local_860 = local_870 + 1 + local_860;
            local_870 = local_870 - (local_868 & 1 ^ 1);
          }
          local_868 = local_870;
          local_870 = (long)local_870 >> 1;
        }
        if (local_860 < 1) {
          if ((long)local_20[-1] < 0) {
            in_stack_fffffffffffff6d0 = (saidx64_t *)(local_20[-1] ^ 0xffffffffffffffff);
          }
          else {
            in_stack_fffffffffffff6d0 = (saidx64_t *)local_20[-1];
          }
          in_stack_fffffffffffff6d8 = local_8;
          in_stack_fffffffffffff6e0 = local_10;
          sVar2 = ss_compare((sauchar_t *)local_8,local_10 + (long)in_stack_fffffffffffff6d0,
                             local_10 + *local_20,in_stack_00000010);
          if (sVar2 == 0) {
            *local_20 = *local_20 ^ 0xffffffffffffffff;
          }
          if ((local_878 & 1) == 0) {
            if ((local_878 & 2) != 0) {
              if ((long)local_18[-1] < 0) {
                local_948 = local_18[-1] ^ 0xffffffffffffffff;
              }
              else {
                local_948 = local_18[-1];
              }
              in_stack_fffffffffffff6c8 = local_10;
              sVar2 = ss_compare((sauchar_t *)local_8,local_10 + local_948,local_10 + *local_18,
                                 in_stack_00000010);
              if (sVar2 == 0) goto LAB_001050e7;
            }
          }
          else {
LAB_001050e7:
            *local_18 = *local_18 ^ 0xffffffffffffffff;
          }
          if ((local_878 & 4) != 0) {
            if ((long)local_28[-1] < 0) {
              local_960 = local_28[-1] ^ 0xffffffffffffffff;
            }
            else {
              local_960 = local_28[-1];
            }
            sVar2 = ss_compare((sauchar_t *)local_8,local_10 + local_960,local_10 + *local_28,
                               in_stack_00000010);
            if (sVar2 == 0) {
              *local_28 = *local_28 ^ 0xffffffffffffffff;
            }
          }
          if (local_874 == 0) {
            return;
          }
          local_874 = local_874 + -1;
          local_18 = (ulong *)local_838[(long)local_874 * 4];
          local_20 = (ulong *)local_838[(long)local_874 * 4 + 1];
          local_28 = *(ulong **)(auStack_820 + (long)local_874 * 8 + -2);
          local_878 = auStack_820[(long)local_874 * 8];
        }
        else {
          a = local_20 + -local_860;
          puVar4 = local_20 + local_860;
          ss_blockswap((saidx64_t *)a,(saidx64_t *)local_20,local_860);
          local_848 = local_20;
          local_840 = local_20;
          local_87c = 0;
          if (puVar4 < local_28) {
            if ((long)*puVar4 < 0) {
              *puVar4 = *puVar4 ^ 0xffffffffffffffff;
              if (local_18 < a) {
                do {
                  puVar5 = local_840 + -1;
                  puVar1 = local_840 + -1;
                  local_840 = puVar5;
                } while ((long)*puVar1 < 0);
                local_87c = 4;
              }
              local_87c = local_87c | 1;
            }
            else if (local_18 < a) {
              for (; (long)*local_848 < 0; local_848 = local_848 + 1) {
              }
              local_87c = 2;
            }
          }
          if ((long)local_28 - (long)local_848 >> 3 < (long)local_840 - (long)local_18 >> 3) {
            if (((local_87c & 2) != 0) && (local_848 == local_20)) {
              local_87c = local_87c ^ 6;
            }
            local_838[(long)local_874 * 4] = local_18;
            local_838[(long)local_874 * 4 + 1] = a;
            *(ulong **)(auStack_820 + (long)local_874 * 8 + -2) = local_840;
            auStack_820[(long)local_874 * 8] = local_878 & 3 | local_87c & 4;
            local_18 = local_848;
            local_20 = puVar4;
            local_878 = local_87c & 3 | local_878 & 4;
          }
          else {
            local_838[(long)local_874 * 4] = local_848;
            local_838[(long)local_874 * 4 + 1] = puVar4;
            *(ulong **)(auStack_820 + (long)local_874 * 8 + -2) = local_28;
            auStack_820[(long)local_874 * 8] = local_87c & 3 | local_878 & 4;
            local_20 = a;
            local_28 = local_840;
            local_878 = local_878 & 3 | local_87c & 4;
          }
          local_874 = local_874 + 1;
        }
      }
      else {
        if (local_18 < local_20) {
          ss_mergeforward((sauchar_t *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                          in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
                          in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
                          (saidx64_t)in_stack_fffffffffffff700);
        }
        if ((local_878 & 1) == 0) {
          if ((local_878 & 2) != 0) {
            if ((long)local_18[-1] < 0) {
              local_8c8 = local_18[-1] ^ 0xffffffffffffffff;
            }
            else {
              local_8c8 = local_18[-1];
            }
            sVar2 = ss_compare((sauchar_t *)local_8,local_10 + local_8c8,local_10 + *local_18,
                               in_stack_00000010);
            if (sVar2 == 0) goto LAB_0010479e;
          }
        }
        else {
LAB_0010479e:
          *local_18 = *local_18 ^ 0xffffffffffffffff;
        }
        if ((local_878 & 4) != 0) {
          if ((long)local_28[-1] < 0) {
            local_8e0 = local_28[-1] ^ 0xffffffffffffffff;
          }
          else {
            local_8e0 = local_28[-1];
          }
          sVar2 = ss_compare((sauchar_t *)local_8,local_10 + local_8e0,local_10 + *local_28,
                             in_stack_00000010);
          if (sVar2 == 0) {
            *local_28 = *local_28 ^ 0xffffffffffffffff;
          }
        }
        if (local_874 == 0) {
          return;
        }
        local_874 = local_874 + -1;
        local_18 = (ulong *)local_838[(long)local_874 * 4];
        local_20 = (ulong *)local_838[(long)local_874 * 4 + 1];
        local_28 = *(ulong **)(auStack_820 + (long)local_874 * 8 + -2);
        local_878 = auStack_820[(long)local_874 * 8];
      }
    }
    if ((local_18 < local_20) && (local_20 < local_28)) {
      ss_mergebackward(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0
                       ,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                       in_stack_fffffffffffff6d8,(saidx64_t)in_stack_fffffffffffff710);
    }
    if ((local_878 & 1) == 0) {
      if ((local_878 & 2) != 0) {
        if ((long)local_18[-1] < 0) {
          local_898 = local_18[-1] ^ 0xffffffffffffffff;
        }
        else {
          local_898 = local_18[-1];
        }
        sVar2 = ss_compare((sauchar_t *)local_8,local_10 + local_898,local_10 + *local_18,
                           in_stack_00000010);
        if (sVar2 == 0) goto LAB_001044b8;
      }
    }
    else {
LAB_001044b8:
      *local_18 = *local_18 ^ 0xffffffffffffffff;
    }
    if ((local_878 & 4) != 0) {
      if ((long)local_28[-1] < 0) {
        local_8b0 = local_28[-1] ^ 0xffffffffffffffff;
      }
      else {
        local_8b0 = local_28[-1];
      }
      sVar2 = ss_compare((sauchar_t *)local_8,local_10 + local_8b0,local_10 + *local_28,
                         in_stack_00000010);
      if (sVar2 == 0) {
        *local_28 = *local_28 ^ 0xffffffffffffffff;
      }
    }
    if (local_874 == 0) {
      return;
    }
    local_874 = local_874 + -1;
    local_18 = (ulong *)local_838[(long)local_874 * 4];
    local_20 = (ulong *)local_838[(long)local_874 * 4 + 1];
    local_28 = *(ulong **)(auStack_820 + (long)local_874 * 8 + -2);
    local_878 = auStack_820[(long)local_874 * 8];
  } while( true );
}

Assistant:

static
void
ss_swapmerge(const sauchar_t *T, const saidx_t *PA,
             saidx_t *first, saidx_t *middle, saidx_t *last,
             saidx_t *buf, saidx_t bufsize, saidx_t depth) {
#define STACK_SIZE SS_SMERGE_STACKSIZE
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a, b, c)\
  do {\
    if(((c) & 1) ||\
       (((c) & 2) && (ss_compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0))) {\
      *(a) = ~*(a);\
    }\
    if(((c) & 4) && ((ss_compare(T, PA + GETIDX(*((b) - 1)), PA + *(b), depth) == 0))) {\
      *(b) = ~*(b);\
    }\
  } while(0)
  struct { saidx_t *a, *b, *c; saint_t d; } stack[STACK_SIZE];
  saidx_t *l, *r, *lm, *rm;
  saidx_t m, len, half;
  saint_t ssize;
  saint_t check, next;

  for(check = 0, ssize = 0;;) {
    if((last - middle) <= bufsize) {
      if((first < middle) && (middle < last)) {
        ss_mergebackward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    if((middle - first) <= bufsize) {
      if(first < middle) {
        ss_mergeforward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    for(m = 0, len = MIN(middle - first, last - middle), half = len >> 1;
        0 < len;
        len = half, half >>= 1) {
      if(ss_compare(T, PA + GETIDX(*(middle + m + half)),
                       PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= (len & 1) ^ 1;
      }
    }

    if(0 < m) {
      lm = middle - m, rm = middle + m;
      ss_blockswap(lm, middle, m);
      l = r = middle, next = 0;
      if(rm < last) {
        if(*rm < 0) {
          *rm = ~*rm;
          if(first < lm) { for(; *--l < 0;) { } next |= 4; }
          next |= 1;
        } else if(first < lm) {
          for(; *r < 0; ++r) { }
          next |= 2;
        }
      }

      if((l - first) <= (last - r)) {
        STACK_PUSH(r, rm, last, (next & 3) | (check & 4));
        middle = lm, last = l, check = (check & 3) | (next & 4);
      } else {
        if((next & 2) && (r == middle)) { next ^= 6; }
        STACK_PUSH(first, lm, l, (check & 3) | (next & 4));
        first = r, middle = rm, check = (next & 3) | (check & 4);
      }
    } else {
      if(ss_compare(T, PA + GETIDX(*(middle - 1)), PA + *middle, depth) == 0) {
        *middle = ~*middle;
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
    }
  }
#undef STACK_SIZE
}